

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter>::
AdapterPromiseNode<kj::UnixEventPort&,int&>
          (AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter> *this,
          UnixEventPort *params,int *params_1)

{
  UnixEventPort *loop;
  int *piVar1;
  int *params_local_1;
  UnixEventPort *params_local;
  AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<siginfo_t>::PromiseFulfiller((PromiseFulfiller<siginfo_t> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_00ce1a78;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_00ce1ac0;
  ExceptionOr<siginfo_t>::ExceptionOr((ExceptionOr<siginfo_t> *)(this + 0x18));
  this[0x200] = (AdapterPromiseNode<siginfo_t,kj::UnixEventPort::SignalPromiseAdapter>)0x1;
  loop = fwd<kj::UnixEventPort&>(params);
  piVar1 = fwd<int&>(params_1);
  UnixEventPort::SignalPromiseAdapter::SignalPromiseAdapter
            ((SignalPromiseAdapter *)(this + 0x208),(PromiseFulfiller<siginfo_t> *)(this + 0x10),
             loop,*piVar1);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}